

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

int N_VInvTest_SensWrapper(N_Vector x,N_Vector z)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  
  plVar2 = (long *)x->content;
  if ((int)plVar2[1] < 1) {
    iVar3 = 1;
  }
  else {
    iVar3 = 1;
    lVar4 = 0;
    do {
      iVar1 = N_VInvTest(*(N_Vector *)(*plVar2 + lVar4 * 8),*(N_Vector *)(*z->content + lVar4 * 8));
      if (iVar1 != 1) {
        iVar3 = 0;
      }
      lVar4 = lVar4 + 1;
      plVar2 = (long *)x->content;
    } while (lVar4 < (int)plVar2[1]);
  }
  return iVar3;
}

Assistant:

sunbooleantype N_VInvTest_SensWrapper(N_Vector x, N_Vector z)
{
  int i;
  sunbooleantype no_zero_found, tmp;

  no_zero_found = SUNTRUE;

  for (i = 0; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VInvTest(NV_VEC_SW(x, i), NV_VEC_SW(z, i));
    if (tmp != SUNTRUE) { no_zero_found = SUNFALSE; }
  }

  return (no_zero_found);
}